

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> __thiscall
pbrt::Integrator::Create
          (Integrator *this,string *name,ParameterDictionary *parameters,CameraHandle *camera,
          SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,
          RGBColorSpace *colorSpace,FileLoc *loc)

{
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights_00;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights_01;
  undefined8 uVar1;
  int iVar2;
  pointer *__ptr;
  char *fmt;
  RGBColorSpace *this_00;
  undefined1 in_stack_fffffffffffffdc0 [16];
  undefined1 local_230 [80];
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_1e0;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_1d8;
  undefined1 local_1c0 [16];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_1b0;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_198;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_180;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_168;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_150;
  undefined1 local_138 [24];
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_120;
  undefined1 local_118 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_100;
  undefined1 local_e8 [24];
  undefined1 local_d0 [24];
  undefined1 local_b8 [24];
  undefined1 local_a0 [24];
  undefined1 local_88 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_70;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_58;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_40;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_38;
  
  this->_vptr_Integrator = (_func_int **)0x0;
  local_230._8_8_ = parameters;
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 == 0) {
    local_150.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(camera->
                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  ).bits;
    local_150.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(sampler->
                  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
    local_150.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(aggregate->
                  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                  ).bits;
    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_88,lights);
    this_00 = (RGBColorSpace *)local_230._8_8_;
    PathIntegrator::Create
              ((ParameterDictionary *)local_230,(CameraHandle *)local_230._8_8_,
               (SamplerHandle *)
               &local_150.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (PrimitiveHandle *)
               &local_150.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish,&local_150,(FileLoc *)local_88);
    this->_vptr_Integrator = (_func_int **)local_230._0_8_;
joined_r0x004104e0:
    local_230._0_8_ = (memory_resource *)0x0;
    if ((pointer)local_88._0_8_ != (pointer)0x0) {
      local_230._0_8_ = (memory_resource *)0x0;
      operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)name);
    this_00 = (RGBColorSpace *)local_230._8_8_;
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 == 0) {
        local_168.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(camera->
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      ).bits;
        local_168.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(sampler->
                      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits;
        local_168.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(aggregate->
                      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                      ).bits;
        std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                  ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_a0,lights)
        ;
        this_00 = (RGBColorSpace *)local_230._8_8_;
        SimplePathIntegrator::Create
                  ((ParameterDictionary *)local_230,(CameraHandle *)local_230._8_8_,
                   (SamplerHandle *)
                   &local_168.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (PrimitiveHandle *)
                   &local_168.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_finish,&local_168,(FileLoc *)local_a0);
        this->_vptr_Integrator = (_func_int **)local_230._0_8_;
        local_88._0_8_ = local_a0._0_8_;
        local_88._16_8_ = local_a0._16_8_;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)name);
        if (iVar2 == 0) {
          local_180.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(camera->
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        ).bits;
          local_180.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)(sampler->
                        super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                        ).bits;
          local_180.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)(aggregate->
                        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                        ).bits;
          std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                    ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_b8,
                     lights);
          this_00 = (RGBColorSpace *)local_230._8_8_;
          LightPathIntegrator::Create
                    ((ParameterDictionary *)local_230,(CameraHandle *)local_230._8_8_,
                     (SamplerHandle *)
                     &local_180.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (PrimitiveHandle *)
                     &local_180.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_finish,&local_180,(FileLoc *)local_b8);
          this->_vptr_Integrator = (_func_int **)local_230._0_8_;
          local_88._0_8_ = local_b8._0_8_;
          local_88._16_8_ = local_b8._16_8_;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)name);
          if (iVar2 == 0) {
            local_198.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(camera->
                          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                          ).bits;
            local_198.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)(sampler->
                          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                          ).bits;
            local_198.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(aggregate->
                          super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                          ).bits;
            std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                      ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_d0,
                       lights);
            this_00 = (RGBColorSpace *)local_230._8_8_;
            SimpleVolPathIntegrator::Create
                      ((ParameterDictionary *)local_230,(CameraHandle *)local_230._8_8_,
                       (SamplerHandle *)
                       &local_198.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (PrimitiveHandle *)
                       &local_198.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data._M_finish,&local_198,(FileLoc *)local_d0);
            this->_vptr_Integrator = (_func_int **)local_230._0_8_;
            local_88._0_8_ = local_d0._0_8_;
            local_88._16_8_ = local_d0._16_8_;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)name);
            if (iVar2 == 0) {
              local_1b0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(camera->
                            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                            ).bits;
              local_1b0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)(sampler->
                            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                            ).bits;
              local_1b0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)(aggregate->
                            super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                            ).bits;
              std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                        ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_e8,
                         lights);
              this_00 = (RGBColorSpace *)local_230._8_8_;
              VolPathIntegrator::Create
                        ((ParameterDictionary *)local_230,(CameraHandle *)local_230._8_8_,
                         (SamplerHandle *)
                         &local_1b0.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (PrimitiveHandle *)
                         &local_1b0.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_finish,&local_1b0,(FileLoc *)local_e8);
              this->_vptr_Integrator = (_func_int **)local_230._0_8_;
              local_88._0_8_ = local_e8._0_8_;
              local_88._16_8_ = local_e8._16_8_;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)name);
              if (iVar2 == 0) {
                local_1c0._8_8_ =
                     (camera->
                     super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                     ).bits;
                local_1c0._0_8_ =
                     (sampler->
                     super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     ).bits;
                local_1d8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(aggregate->
                              super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                              ).bits;
                std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                          (&local_100,lights);
                this_00 = (RGBColorSpace *)local_230._8_8_;
                BDPTIntegrator::Create
                          ((BDPTIntegrator *)local_230,(ParameterDictionary *)local_230._8_8_,
                           (CameraHandle *)(local_1c0 + 8),(SamplerHandle *)local_1c0,
                           (PrimitiveHandle *)
                           &local_1d8.
                            super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_100,loc);
                this->_vptr_Integrator = (_func_int **)local_230._0_8_;
                local_88._0_8_ =
                     local_100.
                     super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                local_88._16_8_ =
                     local_100.
                     super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)name);
                if (iVar2 == 0) {
                  local_1d8.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       (pointer)(camera->
                                super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                                ).bits;
                  local_1d8.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)(aggregate->
                                super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                                ).bits;
                  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                             local_118,lights);
                  this_00 = (RGBColorSpace *)local_230._8_8_;
                  MLTIntegrator::Create
                            ((ParameterDictionary *)local_230,(CameraHandle *)local_230._8_8_,
                             (PrimitiveHandle *)
                             &local_1d8.
                              super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&local_1d8,
                             (FileLoc *)local_118);
                  this->_vptr_Integrator = (_func_int **)local_230._0_8_;
                  local_88._0_8_ = local_118._0_8_;
                  local_88._16_8_ = local_118._16_8_;
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)name);
                  if (iVar2 == 0) {
                    local_120.bits = (ulong)&colorSpace->illuminant | 0x2000000000000;
                    local_1e0.bits =
                         (camera->
                         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                         ).bits;
                    local_230._72_8_ =
                         (sampler->
                         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                         ).bits;
                    local_230._64_8_ =
                         (aggregate->
                         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                         ).bits;
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                              (&local_58,lights);
                    this_00 = (RGBColorSpace *)local_230._8_8_;
                    lights_01.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         (pointer)in_stack_fffffffffffffdc0._0_8_;
                    lights_01.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)in_stack_fffffffffffffdc0._8_8_;
                    lights_01.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)&local_58;
                    AOIntegrator::Create
                              ((ParameterDictionary *)local_230,(SpectrumHandle *)local_230._8_8_,
                               (CameraHandle *)&local_120,(SamplerHandle *)&local_1e0,
                               (PrimitiveHandle *)(local_230 + 0x48),lights_01,
                               (FileLoc *)(local_230 + 0x40));
                    this->_vptr_Integrator = (_func_int **)local_230._0_8_;
                    local_88._0_8_ =
                         local_58.
                         super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                    local_88._16_8_ =
                         local_58.
                         super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)name);
                    if (iVar2 == 0) {
                      local_230._56_8_ =
                           (camera->
                           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                           ).bits;
                      local_230._48_8_ =
                           (sampler->
                           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                           ).bits;
                      local_230._40_8_ =
                           (aggregate->
                           super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                           ).bits;
                      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                                ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                                 local_138,lights);
                      this_00 = (RGBColorSpace *)local_230._8_8_;
                      RandomWalkIntegrator::Create
                                ((ParameterDictionary *)local_230,(CameraHandle *)local_230._8_8_,
                                 (SamplerHandle *)(local_230 + 0x38),
                                 (PrimitiveHandle *)(local_230 + 0x30),
                                 (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                                 (local_230 + 0x28),(FileLoc *)local_138);
                      this->_vptr_Integrator = (_func_int **)local_230._0_8_;
                      local_88._0_8_ = local_138._0_8_;
                      local_88._16_8_ = local_138._16_8_;
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)name);
                      if (iVar2 != 0) {
                        fmt = "%s: integrator type unknown.";
                        goto LAB_00410ae2;
                      }
                      local_230._32_8_ =
                           (camera->
                           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                           ).bits;
                      local_230._24_8_ =
                           (sampler->
                           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                           ).bits;
                      local_230._16_8_ =
                           (aggregate->
                           super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                           ).bits;
                      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                                (&local_70,lights);
                      this_00 = (RGBColorSpace *)local_230._8_8_;
                      lights_00.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           (pointer)in_stack_fffffffffffffdc0._0_8_;
                      lights_00.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)in_stack_fffffffffffffdc0._8_8_;
                      lights_00.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)&local_70;
                      SPPMIntegrator::Create
                                ((ParameterDictionary *)local_230,(RGBColorSpace *)local_230._8_8_,
                                 (CameraHandle *)colorSpace,(SamplerHandle *)(local_230 + 0x20),
                                 (PrimitiveHandle *)(local_230 + 0x18),lights_00,
                                 (FileLoc *)(local_230 + 0x10));
                      this->_vptr_Integrator = (_func_int **)local_230._0_8_;
                      local_88._0_8_ =
                           local_70.
                           super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      local_88._16_8_ =
                           local_70.
                           super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto joined_r0x004104e0;
    }
    local_38.bits =
         (camera->
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         ).bits;
    local_40.bits =
         (sampler->
         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    FunctionIntegrator::Create
              ((FunctionIntegrator *)local_230,(ParameterDictionary *)local_230._8_8_,
               (CameraHandle *)&local_38,(SamplerHandle *)&local_40,loc);
    uVar1 = local_230._0_8_;
    local_230._0_8_ = (memory_resource *)0x0;
    this->_vptr_Integrator = (_func_int **)uVar1;
  }
  if (this->_vptr_Integrator != (_func_int **)0x0) {
    ParameterDictionary::ReportUnused((ParameterDictionary *)this_00);
    return (__uniq_ptr_data<pbrt::Integrator,_std::default_delete<pbrt::Integrator>,_true,_true>)
           (__uniq_ptr_data<pbrt::Integrator,_std::default_delete<pbrt::Integrator>,_true,_true>)
           this;
  }
  fmt = "%s: unable to create integrator.";
LAB_00410ae2:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

std::unique_ptr<Integrator> Integrator::Create(
    const std::string &name, const ParameterDictionary &parameters, CameraHandle camera,
    SamplerHandle sampler, PrimitiveHandle aggregate, std::vector<LightHandle> lights,
    const RGBColorSpace *colorSpace, const FileLoc *loc) {
    std::unique_ptr<Integrator> integrator;
    if (name == "path")
        integrator =
            PathIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "function")
        integrator = FunctionIntegrator::Create(parameters, camera, sampler, loc);
    else if (name == "simplepath")
        integrator = SimplePathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "lightpath")
        integrator = LightPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                 lights, loc);
    else if (name == "simplevolpath")
        integrator = SimpleVolPathIntegrator::Create(parameters, camera, sampler,
                                                     aggregate, lights, loc);
    else if (name == "volpath")
        integrator = VolPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                               lights, loc);
    else if (name == "bdpt")
        integrator =
            BDPTIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "mlt")
        integrator = MLTIntegrator::Create(parameters, camera, aggregate, lights, loc);
    else if (name == "ambientocclusion")
        integrator = AOIntegrator::Create(parameters, &colorSpace->illuminant, camera,
                                          sampler, aggregate, lights, loc);
    else if (name == "randomwalk")
        integrator = RandomWalkIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "sppm")
        integrator = SPPMIntegrator::Create(parameters, colorSpace, camera, sampler,
                                            aggregate, lights, loc);
    else
        ErrorExit(loc, "%s: integrator type unknown.", name);

    if (!integrator)
        ErrorExit(loc, "%s: unable to create integrator.", name);

    parameters.ReportUnused();
    return integrator;
}